

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O3

StatementContext psy::C::operator+(StatementContext a,StatementContext b)

{
  ostream *poVar1;
  undefined7 in_register_00000039;
  
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    break;
  case 1:
    b = (b == Loop) * '\x02' + Switch;
    break;
  case 2:
    b = b == Switch | Loop;
    break;
  case 3:
    b = SwitchAndLoop;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x41f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    b = None;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"",0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return b;
}

Assistant:

Parser::StatementContext operator+(Parser::StatementContext a,
                                   Parser::StatementContext b)
{
    switch (a) {
        case Parser::StatementContext::None:
            return b;

        case Parser::StatementContext::Switch:
            if (b == Parser::StatementContext::Loop)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::Loop:
            if (b == Parser::StatementContext::Switch)
                return Parser::StatementContext::SwitchAndLoop;
            return a;

        case Parser::StatementContext::SwitchAndLoop:
            return a;

        default:
            PSY_ASSERT_3(false, return Parser::StatementContext::None, "");
    }
}